

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  Mat *pMVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  undefined4 *puVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  undefined4 *puVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 *puVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  Convolution_x86 *local_108;
  ulong local_100;
  Mat local_f8;
  ulong local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  int local_a0;
  int local_9c;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  Mat *local_70;
  Mat *local_68;
  Mat *local_60;
  Mat *local_58;
  conv_func local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_178 = bottom_blob->w;
  uVar23 = bottom_blob->h;
  uVar16 = (ulong)uVar23;
  uVar11 = (this->super_Convolution).kernel_w;
  local_88 = (ulong)uVar11;
  uVar1 = (this->super_Convolution).dilation_w;
  local_100 = (ulong)uVar1;
  iVar2 = (this->super_Convolution).stride_w;
  local_f8.data = bottom_blob->data;
  local_f8.refcount = bottom_blob->refcount;
  local_f8.elemsize = bottom_blob->elemsize;
  local_f8.dims = bottom_blob->dims;
  if (local_f8.refcount != (int *)0x0) {
    LOCK();
    *local_f8.refcount = *local_f8.refcount + 1;
    UNLOCK();
  }
  iVar14 = (uVar11 - 1) * uVar1;
  local_f8.w = bottom_blob->w;
  local_f8.h = bottom_blob->h;
  local_f8.c = bottom_blob->c;
  local_f8.cstep = bottom_blob->cstep;
  iVar8 = (this->super_Convolution).pad_w;
  local_50 = conv;
  if ((iVar8 < 1) && (iVar13 = (this->super_Convolution).pad_h, iVar13 < 1)) {
    if (iVar13 == -0xe9 && iVar8 == -0xe9) {
      iVar13 = iVar14 - (local_178 + -1) % iVar2;
      iVar8 = iVar14 - (int)(uVar23 - 1) % iVar2;
      if ((iVar13 < 1) && (iVar8 < 1)) {
LAB_0010b5c5:
        local_178 = local_f8.w;
        uVar16 = (ulong)local_f8._28_8_ >> 0x20;
        bVar4 = true;
      }
      else {
        copy_make_border(bottom_blob,&local_f8,iVar8 / 2,iVar8 - iVar8 / 2,iVar13 / 2,
                         iVar13 - iVar13 / 2,0,0.0);
        if (local_f8.data == (void *)0x0) {
          bVar4 = false;
        }
        else {
          if ((long)local_f8.c * local_f8.cstep != 0) goto LAB_0010b5c5;
          bVar4 = false;
        }
      }
      iVar8 = -100;
      if (!bVar4) goto LAB_0010b645;
    }
  }
  else {
    iVar13 = (this->super_Convolution).pad_h;
    copy_make_border(bottom_blob,&local_f8,iVar13,iVar13,iVar8,iVar8,0,0.0);
    iVar8 = -100;
    if ((local_f8.data == (void *)0x0) || ((long)local_f8.c * local_f8.cstep == 0))
    goto LAB_0010b645;
    local_178 = local_f8.w;
    uVar16 = (ulong)local_f8._28_8_ >> 0x20;
  }
  iVar13 = (local_178 - (iVar14 + 1)) / iVar2 + 1;
  iVar15 = ((int)uVar16 - (iVar14 + 1)) / iVar2 + 1;
  iVar8 = (this->super_Convolution).num_output;
  auVar26._0_4_ = -(uint)(top_blob->dims == 3);
  auVar26._4_4_ = -(uint)(iVar13 == top_blob->w);
  auVar26._8_4_ = -(uint)(iVar15 == top_blob->h);
  auVar26._12_4_ = -(uint)(iVar8 == top_blob->c);
  iVar14 = movmskps(3,auVar26);
  if ((iVar14 != 0xf) || (top_blob->elemsize != 4)) {
    piVar3 = top_blob->refcount;
    local_108 = this;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
        local_a8 = uVar16;
        free(*(void **)((long)top_blob->data + -8));
        uVar16 = local_a8;
      }
    }
    this = local_108;
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = iVar13;
    top_blob->h = iVar15;
    top_blob->c = iVar8;
    uVar24 = (long)(iVar15 * iVar13) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = uVar24;
    lVar25 = uVar24 * (long)iVar8;
    if (lVar25 != 0) {
      pvVar7 = malloc(lVar25 * 4 + 0x1c);
      pvVar9 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar7;
      top_blob->data = pvVar9;
      piVar3 = (int *)((long)pvVar9 + lVar25 * 4);
      top_blob->refcount = piVar3;
      *piVar3 = 1;
    }
  }
  uVar24 = local_100;
  iVar8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_118 = (undefined1  [16])0x0;
    local_128 = (undefined1  [16])0x0;
    local_138 = (undefined1  [16])0x0;
    local_148 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    iVar14 = (int)local_100;
    if (iVar14 < 1) {
      iVar8 = 0;
    }
    else {
      local_9c = iVar14 + local_178 + -1;
      local_a0 = iVar14 + -1 + (int)uVar16;
      local_58 = &(this->super_Convolution).weight_data;
      local_60 = &(this->super_Convolution).bias_data;
      local_80 = (long)local_178 << 2;
      local_78 = (long)iVar13 << 2;
      local_a8 = (long)(iVar13 * iVar14) << 2;
      local_b8 = 0;
      local_c0 = 0;
      local_c8 = 0;
      local_108 = this;
      local_70 = top_blob;
      local_68 = bottom_blob;
      do {
        uVar16 = (long)(local_a0 - (int)local_c8) / (long)(int)local_100;
        iVar13 = (int)uVar16;
        uVar12 = (long)(iVar13 - (int)local_88) / (long)iVar2;
        local_40 = uVar12 & 0xffffffff;
        uVar23 = (int)uVar12 + 1;
        local_98 = local_b8;
        local_90 = local_c0;
        uVar12 = 0;
        do {
          pMVar5 = local_68;
          uVar21 = (long)(local_9c - (int)uVar12) / (long)(int)local_100;
          iVar6 = (int)uVar21;
          iVar15 = (iVar6 - (int)local_88) / iVar2;
          local_48 = uVar12;
          if ((local_128._12_4_ != iVar6) || (local_118._0_4_ != iVar13)) {
            iVar8 = local_68->c;
            if ((local_128._12_4_ != iVar6) ||
               ((((local_128._8_4_ != 3 || (local_118._0_4_ != iVar13)) ||
                 (local_118._4_4_ != iVar8)) || (local_128._0_8_ != 4)))) {
              if ((int *)local_138._8_8_ != (int *)0x0) {
                LOCK();
                *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
                UNLOCK();
                if ((*(int *)local_138._8_8_ == 0) && ((void *)local_138._0_8_ != (void *)0x0)) {
                  free(*(void **)(local_138._0_8_ + -8));
                }
              }
              local_138 = (undefined1  [16])0x0;
              local_128._8_4_ = 3;
              local_128._0_8_ = 4;
              local_128._12_4_ = iVar6;
              local_118._4_4_ = iVar8;
              local_118._0_4_ = iVar13;
              local_118._8_8_ = (long)(iVar13 * iVar6) + 3U & 0x3ffffffffffffffc;
              lVar25 = local_118._8_8_ * (long)iVar8;
              if (lVar25 != 0) {
                pvVar7 = malloc(lVar25 * 4 + 0x1c);
                local_138._0_8_ = (long)pvVar7 + 0x17U & 0xfffffffffffffff0;
                *(void **)(local_138._0_8_ - 8) = pvVar7;
                local_138._8_8_ = local_138._0_8_ + lVar25 * 4;
                *(undefined4 *)local_138._8_8_ = 1;
              }
            }
            iVar8 = -100;
            if ((void *)local_138._0_8_ == (void *)0x0) goto LAB_0010b5de;
            if ((long)(int)local_118._4_4_ * local_118._8_8_ == 0) goto LAB_0010b5de;
          }
          uVar11 = iVar15 + 1;
          if ((local_158._12_4_ != uVar11) || (local_148._0_4_ != uVar23)) {
            iVar8 = (local_108->super_Convolution).num_output;
            if (((local_158._12_4_ != uVar11) ||
                (((local_158._8_4_ != 3 || (local_148._0_4_ != uVar23)) ||
                 (local_148._4_4_ != iVar8)))) || (local_158._0_8_ != 4)) {
              if ((int *)local_168._8_8_ != (int *)0x0) {
                LOCK();
                *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + -1;
                UNLOCK();
                if ((*(int *)local_168._8_8_ == 0) && ((void *)local_168._0_8_ != (void *)0x0)) {
                  free(*(void **)(local_168._0_8_ + -8));
                }
              }
              local_168 = (undefined1  [16])0x0;
              local_158._8_4_ = 3;
              local_158._0_8_ = 4;
              local_158._12_4_ = uVar11;
              local_148._4_4_ = iVar8;
              local_148._0_4_ = uVar23;
              local_148._8_8_ = (long)(int)(uVar23 * uVar11) + 3U & 0x3ffffffffffffffc;
              lVar25 = local_148._8_8_ * (long)iVar8;
              if (lVar25 != 0) {
                pvVar7 = malloc(lVar25 * 4 + 0x1c);
                local_168._0_8_ = (long)pvVar7 + 0x17U & 0xfffffffffffffff0;
                *(void **)(local_168._0_8_ - 8) = pvVar7;
                local_168._8_8_ = local_168._0_8_ + lVar25 * 4;
                *(undefined4 *)local_168._8_8_ = 1;
              }
            }
            iVar8 = -100;
            if ((void *)local_168._0_8_ == (void *)0x0) goto LAB_0010b5de;
            if ((long)(int)local_148._4_4_ * local_148._8_8_ == 0) goto LAB_0010b5de;
          }
          iVar8 = pMVar5->c;
          if (0 < (long)iVar8) {
            lVar25 = (long)local_f8.data + local_90;
            local_38 = local_f8.cstep * local_f8.elemsize;
            local_b0 = local_118._8_8_ * local_128._0_8_;
            lVar18 = 0;
            pvVar7 = (void *)local_138._0_8_;
            do {
              if (0 < iVar13) {
                iVar19 = 0;
                uVar12 = 0;
                pvVar9 = pvVar7;
                do {
                  if (0 < iVar6) {
                    puVar10 = (undefined4 *)(lVar25 + (long)iVar19 * 4);
                    uVar20 = 0;
                    do {
                      *(undefined4 *)((long)pvVar9 + uVar20 * 4) = *puVar10;
                      uVar20 = uVar20 + 1;
                      puVar10 = puVar10 + uVar24;
                    } while ((uVar21 & 0xffffffff) != uVar20);
                  }
                  uVar12 = uVar12 + 1;
                  iVar19 = iVar19 + local_178 * iVar14;
                  pvVar9 = (void *)((long)pvVar9 + (long)iVar6 * 4);
                } while (uVar12 != (uVar16 & 0xffffffff));
              }
              lVar18 = lVar18 + 1;
              lVar25 = lVar25 + local_38;
              pvVar7 = (void *)((long)pvVar7 + local_b0);
            } while (lVar18 != iVar8);
          }
          (*local_50)((Mat *)local_138,(Mat *)local_168,local_58,local_60);
          lVar25 = (long)(local_108->super_Convolution).num_output;
          if (0 < lVar25) {
            puVar10 = (undefined4 *)((long)local_70->data + local_98);
            local_b0 = local_70->cstep * local_70->elemsize;
            lVar18 = 0;
            pvVar7 = (void *)local_168._0_8_;
            do {
              if (-1 < (int)local_40) {
                uVar12 = 0;
                puVar17 = puVar10;
                pvVar9 = pvVar7;
                do {
                  if (-1 < iVar15) {
                    uVar21 = 0;
                    puVar22 = puVar17;
                    do {
                      *puVar22 = *(undefined4 *)((long)pvVar9 + uVar21 * 4);
                      uVar21 = uVar21 + 1;
                      puVar22 = puVar22 + uVar24;
                    } while (uVar11 != uVar21);
                  }
                  uVar12 = uVar12 + 1;
                  puVar17 = (undefined4 *)((long)puVar17 + local_a8);
                  pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar11 * 4);
                } while (uVar12 != uVar23);
              }
              lVar18 = lVar18 + 1;
              puVar10 = (undefined4 *)((long)puVar10 + local_b0);
              pvVar7 = (void *)((long)pvVar7 + local_148._8_8_ * local_158._0_8_);
            } while (lVar18 != lVar25);
          }
          uVar12 = local_48 + 1;
          local_90 = local_90 + 4;
          local_98 = local_98 + 4;
        } while (uVar12 != local_100);
        local_c8 = local_c8 + 1;
        local_c0 = local_c0 + local_80;
        local_b8 = local_b8 + local_78;
        iVar8 = 0;
      } while (local_c8 != local_100);
    }
LAB_0010b5de:
    if ((int *)local_168._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + -1;
      UNLOCK();
      if ((*(int *)local_168._8_8_ == 0) && ((void *)local_168._0_8_ != (void *)0x0)) {
        free(*(void **)(local_168._0_8_ + -8));
      }
    }
    if ((int *)local_138._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
      UNLOCK();
      if ((*(int *)local_138._8_8_ == 0) && ((void *)local_138._0_8_ != (void *)0x0)) {
        free(*(void **)(local_138._0_8_ + -8));
      }
    }
  }
LAB_0010b645:
  if (local_f8.refcount != (int *)0x0) {
    LOCK();
    *local_f8.refcount = *local_f8.refcount + -1;
    UNLOCK();
    if ((*local_f8.refcount == 0) && (local_f8.data != (void *)0x0)) {
      free(*(void **)((long)local_f8.data + -8));
    }
  }
  return iVar8;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            if (inner_bottom_blob.w != inner_w || inner_bottom_blob.h != inner_h)
            {
                inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c);

                if (inner_bottom_blob.empty())
                {
                    return -100;
                }
            }

            if (inner_top_blob.w != inner_outw || inner_top_blob.h != inner_outh)
            {
                inner_top_blob.create(inner_outw, inner_outh, num_output);

                if (inner_top_blob.empty())
                {
                    return -100;
                }
            }

            #pragma omp parallel for
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data);

            #pragma omp parallel for
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}